

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplication::setPalette(QPalette *palette,char *className)

{
  QCoreApplication *pQVar1;
  QApplicationPrivate *pQVar2;
  char *in_RSI;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  ResolveMask originalResolveMask;
  QPalette polishedPalette;
  undefined1 in_stack_ffffffffffffffa8 [16];
  QByteArray local_30;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (char *)0x0) {
    QGuiApplication::setPalette(in_RDI);
  }
  else {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::QPalette((QPalette *)local_18,in_RDI);
    if (QApplicationPrivate::app_style != (QStyle *)0x0) {
      QPalette::resolveMask();
      (**(code **)(*(long *)QApplicationPrivate::app_style + 0x80))
                (QApplicationPrivate::app_style,local_18);
      QPalette::setResolveMask((ulonglong)local_18);
    }
    QByteArray::QByteArray(&local_30,in_RSI,-1);
    QHash<QByteArray,_QPalette>::insert
              (in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_,(QPalette *)0x2cb7f2)
    ;
    QByteArray::~QByteArray((QByteArray *)0x2cb805);
    pQVar1 = QCoreApplication::instance();
    if (pQVar1 != (QCoreApplication *)0x0) {
      QCoreApplication::instance();
      pQVar2 = d_func((QApplication *)0x2cb81d);
      (**(code **)(*(long *)pQVar2 + 0xa0))(pQVar2,in_RSI);
    }
    QPalette::~QPalette((QPalette *)local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplication::setPalette(const QPalette &palette, const char* className)
{
    if (className) {
        QPalette polishedPalette = palette;
        if (QApplicationPrivate::app_style) {
            auto originalResolveMask = palette.resolveMask();
            QApplicationPrivate::app_style->polish(polishedPalette);
            polishedPalette.setResolveMask(originalResolveMask);
        }

        QApplicationPrivate::widgetPalettes.insert(className, polishedPalette);
        if (qApp)
            qApp->d_func()->handlePaletteChanged(className);
    } else {
        QGuiApplication::setPalette(palette);
    }
}